

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void __thiscall xe::TestRoot::TestRoot(TestRoot *this)

{
  TestGroup::TestGroup(&this->super_TestGroup,(TestGroup *)0x0,TESTNODETYPE_ROOT,"","");
  (this->super_TestGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestGroup_00127d60;
  return;
}

Assistant:

TestRoot::TestRoot (void)
	: TestGroup(DE_NULL, TESTNODETYPE_ROOT, "", "")
{
}